

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasCordFields(FileDescriptor *file,Options *options)

{
  bool bVar1;
  int iVar2;
  Descriptor *descriptor;
  int local_24;
  int i;
  Options *options_local;
  FileDescriptor *file_local;
  
  local_24 = 0;
  while( true ) {
    iVar2 = FileDescriptor::message_type_count(file);
    if (iVar2 <= local_24) {
      return false;
    }
    descriptor = FileDescriptor::message_type(file,local_24);
    bVar1 = HasCordFields(descriptor,options);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool HasCordFields(const FileDescriptor* file, const Options& options) {
  for (int i = 0; i < file->message_type_count(); ++i) {
    if (HasCordFields(file->message_type(i), options)) return true;
  }
  return false;
}